

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeRefAs(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,RefAsOp op)

{
  undefined8 *puVar1;
  RefAs *this_00;
  undefined1 local_98 [8];
  RefAs curr;
  Result<wasm::Ok> _val;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_98[0] = RefAsId;
  curr.super_SpecificExpression<(wasm::Expression::Id)81>.super_Expression._id = InvalidId;
  curr.super_SpecificExpression<(wasm::Expression::Id)81>.super_Expression._1_7_ = 0;
  curr.super_SpecificExpression<(wasm::Expression::Id)81>.super_Expression.type.id._0_4_ = op;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = this;
  Visitor<wasm::IRBuilder::ChildPopper,_wasm::Result<wasm::Ok>_>::visit
            ((Result<wasm::Ok> *)&curr.value,
             (Visitor<wasm::IRBuilder::ChildPopper,_wasm::Result<wasm::Ok>_> *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),(Expression *)local_98);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _32_8_ = &local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),curr.value,
               &(curr.value)->_id +
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if ((undefined1 *)
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == &local_40) {
      *puVar1 = CONCAT71(uStack_3f,local_40);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_38;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(uStack_3f,local_40);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_48;
    local_40 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _32_8_ = &local_40;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&curr.value);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&curr.value);
    this_00 = (RefAs *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression._id = RefAsId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression.type.id = 0;
    this_00->op = op;
    this_00->value = (Expression *)curr._16_8_;
    RefAs::finalize(this_00);
    push(this,(Expression *)this_00);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeRefAs(RefAsOp op) {
  RefAs curr;
  curr.op = op;
  CHECK_ERR(visitRefAs(&curr));
  push(builder.makeRefAs(op, curr.value));
  return Ok{};
}